

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O1

bool __thiscall LLVMBC::ValueProxy::resolve(ValueProxy *this)

{
  pointer ppVVar1;
  ValueKind VVar2;
  ValueProxy *pVVar3;
  LoggingCallback p_Var4;
  void *pvVar5;
  Value *this_00;
  undefined4 uVar6;
  char buffer [4096];
  char local_1018 [4];
  char acStack_1014 [4];
  char acStack_1010 [4];
  undefined2 uStack_100c;
  undefined2 uStack_100a;
  undefined6 local_1008;
  undefined2 uStack_1002;
  undefined6 uStack_1000;
  undefined2 uStack_ffa;
  
  if (this->proxy != (Value *)0x0) {
    return true;
  }
  ppVVar1 = (this->context->values).
            super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (this->id <
      (ulong)((long)(this->context->values).
                    super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar1 >> 3)) {
    this_00 = ppVVar1[this->id];
    while ((this->proxy = this_00, this_00 != (Value *)0x0 &&
           (VVar2 = Value::get_value_kind(this_00), VVar2 == Proxy))) {
      pVVar3 = cast<LLVMBC::ValueProxy>(this->proxy);
      resolve(pVVar3);
      pVVar3 = cast<LLVMBC::ValueProxy>(this->proxy);
      this_00 = pVVar3->proxy;
    }
    if (this->proxy != (Value *)0x0) {
      return true;
    }
    p_Var4 = ::dxil_spv::get_thread_log_callback();
    if (p_Var4 == (LoggingCallback)0x0) {
      resolve();
      return false;
    }
    local_1008 = 0x786f72702065;
    uStack_1002 = 0x2079;
    uStack_1000 = 0x2e65756c6176;
    uStack_ffa = 10;
    local_1018[0] = 'F';
    local_1018[1] = 'a';
    local_1018[2] = 'i';
    local_1018[3] = 'l';
    acStack_1014[0] = 'e';
    acStack_1014[1] = 'd';
    acStack_1014[2] = ' ';
    acStack_1014[3] = 't';
    acStack_1010[0] = 'o';
    acStack_1010[1] = ' ';
    acStack_1010[2] = 'r';
    acStack_1010[3] = 'e';
    uVar6._0_1_ = 's';
    uVar6._1_1_ = 'o';
    uVar6._2_1_ = 'l';
    uVar6._3_1_ = 'v';
  }
  else {
    p_Var4 = ::dxil_spv::get_thread_log_callback();
    if (p_Var4 == (LoggingCallback)0x0) {
      resolve();
      return false;
    }
    local_1008 = 0x20666f207475;
    uStack_1002 = 0x6172;
    uStack_1000 = 0xa2e65676e;
    local_1018[0] = 'V';
    local_1018[1] = 'a';
    local_1018[2] = 'l';
    local_1018[3] = 'u';
    acStack_1014[0] = 'e';
    acStack_1014[1] = ' ';
    acStack_1014[2] = 'p';
    acStack_1014[3] = 'r';
    acStack_1010[0] = 'o';
    acStack_1010[1] = 'x';
    acStack_1010[2] = 'y';
    acStack_1010[3] = ' ';
    uVar6._0_1_ = 'i';
    uVar6._1_1_ = 's';
    uVar6._2_1_ = ' ';
    uVar6._3_1_ = 'o';
  }
  uStack_100c = (undefined2)uVar6;
  uStack_100a = SUB42(uVar6,2);
  pvVar5 = ::dxil_spv::get_thread_log_callback_userdata();
  (*p_Var4)(pvVar5,Error,local_1018);
  return false;
}

Assistant:

bool ValueProxy::resolve()
{
	if (proxy)
		return true;

	if (id >= context.values.size())
	{
		LOGE("Value proxy is out of range.\n");
		return false;
	}

	proxy = context.values[id];
	while (proxy && proxy->get_value_kind() == ValueKind::Proxy)
	{
		cast<ValueProxy>(proxy)->resolve();
		proxy = cast<ValueProxy>(proxy)->get_proxy_value();
	}

	if (!proxy)
	{
		LOGE("Failed to resolve proxy value.\n");
		return false;
	}
	return true;
}